

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O0

void testReadTiles(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  pointer puVar6;
  short *psVar7;
  float *pfVar8;
  exr_result_t _test_rv_36;
  float *curz;
  uint16_t *curg;
  exr_result_t _test_rv_35;
  exr_result_t _test_rv_34;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> zptr;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> gptr;
  exr_result_t _test_rv_33;
  exr_decode_pipeline_t decoder;
  exr_result_t _test_rv_32;
  uint64_t pchunksz;
  exr_result_t _test_rv_31;
  exr_result_t _test_rv_30;
  exr_result_t _test_rv_29;
  exr_result_t _test_rv_28;
  exr_result_t _test_rv_27;
  exr_result_t _test_rv_26;
  exr_result_t _test_rv_25;
  exr_result_t _test_rv_24;
  exr_result_t _test_rv_23;
  exr_result_t _test_rv_22;
  exr_chunk_info_t cinfo;
  exr_result_t _test_rv_21;
  exr_result_t _test_rv_20;
  exr_result_t _test_rv_19;
  exr_result_t _test_rv_18;
  exr_result_t _test_rv_17;
  exr_result_t _test_rv_16;
  exr_result_t _test_rv_15;
  exr_result_t _test_rv_14;
  exr_result_t _test_rv_13;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  exr_result_t _test_rv_8;
  int levelsy;
  int levelsx;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  int32_t ccount;
  exr_result_t _test_rv_1;
  exr_storage_t ps;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  string fn;
  exr_context_t f;
  char *in_stack_fffffffffffff1e8;
  uchar *puVar9;
  ostream *in_stack_fffffffffffff1f0;
  char *in_stack_fffffffffffff1f8;
  char *in_stack_fffffffffffff200;
  allocator<char> *in_stack_fffffffffffff220;
  char *in_stack_fffffffffffff228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff230;
  undefined8 *local_378;
  short local_370;
  long local_318;
  long local_308;
  int local_194;
  long local_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  uchar local_160 [22];
  char local_14a;
  char local_149;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [4];
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  code *pcStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  allocator<char> local_31;
  string local_30 [32];
  undefined8 local_10 [2];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff230,in_stack_fffffffffffff228,in_stack_fffffffffffff220);
  std::allocator<char>::~allocator(&local_31);
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_58 = 0;
  local_b8 = 0x68;
  uStack_60 = 0xbf800000fffffffe;
  pcStack_b0 = err_cb;
  std::__cxx11::string::operator+=(local_30,"v1.7.test.tiled.exr");
  uVar2 = std::__cxx11::string::c_str();
  local_bc = exr_start_read(local_10,uVar2,&local_b8);
  if (local_bc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_bc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_c4 = exr_get_storage(local_10[0],0,&local_c0);
  if (local_c4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_c0 != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_cc = exr_get_chunk_count(0,0,local_c8);
  if (local_cc != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_cc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_cc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_d0 = exr_get_chunk_count(local_10[0],0xffffffff,local_c8);
  if (local_d0 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_d4 = exr_get_chunk_count(local_10[0],0xb,local_c8);
  if (local_d4 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_d8 = exr_get_chunk_count(local_10[0],0,0);
  if (local_d8 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_dc = exr_get_chunk_count(local_10[0],0,local_c8);
  if (local_dc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_dc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_dc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_e0 = exr_get_scanlines_per_chunk(local_10[0],0,local_c8);
  if (local_e0 != 0x12) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0x12);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_e4 = -1;
  local_e8 = -1;
  local_ec = exr_get_tile_levels(0,0,&local_e4,&local_e8);
  if (local_ec != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_ec);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_ec);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e4 != -1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e8 != -1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_f0 = exr_get_tile_levels(local_10[0],1,&local_e4,&local_e8);
  if (local_f0 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_f0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e4 != -1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e8 != -1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_f4 = exr_get_tile_levels(local_10[0],0,0);
  if (local_f4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_f4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_e4 = -1;
  local_f8 = exr_get_tile_levels(local_10[0],0,&local_e4,0);
  if (local_f8 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_f8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e4 != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_e8 = -1;
  local_fc = exr_get_tile_levels(local_10[0],0,0,&local_e8);
  if (local_fc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_fc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_fc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e8 != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_e8 = -1;
  local_e4 = -1;
  local_100 = exr_get_tile_levels(local_10[0],0,&local_e4,&local_e8);
  if (local_100 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_100);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_100);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e4 != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e8 != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_104 = exr_get_tile_sizes(0,0,0,0,0);
  if (local_104 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_104);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_104);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_108 = exr_get_tile_sizes(local_10[0],0,0xffffffff,0,&local_e4,&local_e8);
  if (local_108 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_108);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_108);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_10c = exr_get_tile_sizes(local_10[0],0,0,0xffffffff,&local_e4,&local_e8);
  if (local_10c != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_10c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_110 = exr_get_tile_sizes(local_10[0],0,0,100,&local_e4,&local_e8);
  if (local_110 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_110);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_110);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_114 = exr_get_tile_sizes(local_10[0],0,100,0,&local_e4,&local_e8);
  if (local_114 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_114);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_114);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_118 = exr_get_tile_sizes(local_10[0],0,0,0,&local_e4,&local_e8);
  if (local_118 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_118);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_118);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e4 != 0xc) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e8 != 0x18) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_e4 = -1;
  local_11c = exr_get_tile_sizes(local_10[0],0,0,0,&local_e4,0);
  if (local_11c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_11c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_11c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e4 != 0xc) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_e8 = -1;
  local_120 = exr_get_tile_sizes(local_10[0],0,0,0,0,&local_e8);
  if (local_120 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_120);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_120);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  if (local_e8 != 0x18) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  local_164 = exr_read_scanline_chunk_info(local_10[0],0,0x2a,local_160);
  if (local_164 != 0x12) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_164);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_164);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0x12);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8);
  }
  puVar9 = local_160;
  local_168 = exr_read_tile_chunk_info(0,0,4,2,0);
  if (local_168 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_168);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_168);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  puVar9 = local_160;
  local_16c = exr_read_tile_chunk_info(local_10[0],0xffffffff,4,2,0);
  if (local_16c != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_16c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_16c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  puVar9 = local_160;
  local_170 = exr_read_tile_chunk_info(local_10[0],1,4,2,0);
  if (local_170 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_170);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_170);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  pcVar4 = (char *)0x0;
  local_174 = exr_read_tile_chunk_info(local_10[0],0,4,2,0);
  if (local_174 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_174);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message(local_174);
    poVar3 = std::operator<<(poVar3,pcVar5);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),pcVar4);
  }
  puVar9 = local_160;
  local_178 = exr_read_tile_chunk_info(local_10[0],0,4,2,0,0xffffffff);
  if (local_178 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_178);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_178);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  puVar9 = local_160;
  local_17c = exr_read_tile_chunk_info(local_10[0],0,4,2,0xffffffff);
  if (local_17c != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_17c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_17c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  puVar9 = local_160;
  local_180 = exr_read_tile_chunk_info(local_10[0],0,4,0xfffffffe,0);
  if (local_180 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_180);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_180);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  puVar9 = local_160;
  local_184 = exr_read_tile_chunk_info(local_10[0],0,0xfffffffc,2,0);
  if (local_184 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_184);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_184);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  puVar9 = local_160;
  local_188 = exr_read_tile_chunk_info(local_10[0],0,4,2,0);
  if (local_188 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_188);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_188);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  local_190 = 0;
  local_194 = exr_get_chunk_unpacked_size(local_10[0],0,&local_190);
  if (local_194 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_194);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_194);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_14a != '\x01') {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_149 != '\0') {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_140 != local_190) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_138 != local_190) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_130 != 0) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_128 != 0) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  iVar1 = exr_decoding_initialize(local_10[0],0,local_160,&local_378);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_370 != 2) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  iVar1 = strcmp((char *)*local_378,"G");
  if (iVar1 != 0) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(char *)((long)local_378 + 0x19) != '\x02') {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(int *)((long)local_378 + 0xc) != 0xc) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(int *)(local_378 + 1) != 0x18) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(int *)(local_378 + 2) != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(int *)((long)local_378 + 0x14) != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  iVar1 = strcmp((char *)local_378[6],"Z");
  if (iVar1 != 0) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(char *)((long)local_378 + 0x49) != '\x04') {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(int *)((long)local_378 + 0x3c) != 0xc) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(int *)(local_378 + 7) != 0x18) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(int *)(local_378 + 8) != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (*(int *)((long)local_378 + 0x44) != 1) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  operator_new__(0x240);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff1f0,puVar9);
  operator_new__(0x480);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff1f0,puVar9);
  puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff1f0);
  memset(puVar6,0,0x240);
  puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff1f0);
  memset(puVar6,0,0x480);
  puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff1f0);
  local_378[5] = puVar6;
  *(undefined4 *)(local_378 + 4) = 2;
  *(undefined4 *)((long)local_378 + 0x24) = 0x18;
  *(undefined2 *)((long)local_378 + 0x1c) = 2;
  puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffff1f0);
  local_378[0xb] = puVar6;
  *(undefined4 *)(local_378 + 10) = 4;
  *(undefined4 *)((long)local_378 + 0x54) = 0x30;
  *(undefined2 *)((long)local_378 + 0x4c) = 4;
  iVar1 = exr_decoding_choose_default_routines(local_10[0],0,&local_378);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  iVar1 = exr_decoding_run(local_10[0],0,&local_378);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_318 != 0) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (local_308 != 0) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  psVar7 = (short *)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *
                               )in_stack_fffffffffffff1f0);
  pfVar8 = (float *)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *
                               )in_stack_fffffffffffff1f0);
  if (*psVar7 != 0x33d5) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  if (1e-06 <= ABS(*pfVar8 - 0.244778)) {
    core_test_fail(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(char *)puVar9);
  }
  iVar1 = exr_decoding_destroy(local_10[0],&local_378);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    in_stack_fffffffffffff1f0 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(in_stack_fffffffffffff1f0,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)poVar3,pcVar4,(uint)((ulong)in_stack_fffffffffffff1f0 >> 0x20),
                   (char *)puVar9);
  }
  exr_finish(local_10);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff1f0);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff1f0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testReadTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

    exr_storage_t ps;
    EXRCORE_TEST_RVAL (exr_get_storage (f, 0, &ps));
    EXRCORE_TEST (EXR_STORAGE_TILED == ps);

    int32_t ccount;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_chunk_count (NULL, 0, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_chunk_count (f, -1, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_chunk_count (f, 11, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_chunk_count (f, 0, NULL));
    EXRCORE_TEST_RVAL (exr_get_chunk_count (f, 0, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_SCAN_TILE_MIXEDAPI,
        exr_get_scanlines_per_chunk (f, 0, &ccount));

    int levelsx = -1, levelsy = -1;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_tile_levels (NULL, 0, &levelsx, &levelsy));
    EXRCORE_TEST (levelsx == -1);
    EXRCORE_TEST (levelsy == -1);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_levels (f, 1, &levelsx, &levelsy));
    EXRCORE_TEST (levelsx == -1);
    EXRCORE_TEST (levelsy == -1);

    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, NULL, NULL));

    levelsx = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, &levelsx, NULL));
    EXRCORE_TEST (levelsx == 1);

    levelsy = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, NULL, &levelsy));
    EXRCORE_TEST (levelsy == 1);

    levelsx = levelsy = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, &levelsx, &levelsy));
    EXRCORE_TEST (levelsx == 1);
    EXRCORE_TEST (levelsy == 1);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_tile_sizes (NULL, 0, 0, 0, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_sizes (f, 0, -1, 0, &levelsx, &levelsy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_sizes (f, 0, 0, -1, &levelsx, &levelsy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_sizes (f, 0, 0, 100, &levelsx, &levelsy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_sizes (f, 0, 100, 0, &levelsx, &levelsy));
    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, &levelsx, &levelsy));
    EXRCORE_TEST (levelsx == 12);
    EXRCORE_TEST (levelsy == 24);
    levelsx = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, &levelsx, NULL));
    EXRCORE_TEST (levelsx == 12);
    levelsy = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, NULL, &levelsy));
    EXRCORE_TEST (levelsy == 24);

    exr_chunk_info_t cinfo;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_SCAN_TILE_MIXEDAPI,
        exr_read_scanline_chunk_info (f, 0, 42, &cinfo));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_read_tile_chunk_info (NULL, 0, 4, 2, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_read_tile_chunk_info (f, -1, 4, 2, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_read_tile_chunk_info (f, 1, 4, 2, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, 4, 2, 0, -1, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, 4, 2, -1, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, 4, -2, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, -4, 2, 0, 0, &cinfo));

    // actually read a tile...
    EXRCORE_TEST_RVAL (exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo));
    uint64_t pchunksz = 0;
    EXRCORE_TEST_RVAL (exr_get_chunk_unpacked_size (f, 0, &pchunksz));
    EXRCORE_TEST (cinfo.type == EXR_STORAGE_TILED);
    EXRCORE_TEST (cinfo.compression == EXR_COMPRESSION_NONE);
    EXRCORE_TEST (cinfo.packed_size == pchunksz);
    EXRCORE_TEST (cinfo.unpacked_size == pchunksz);
    EXRCORE_TEST (cinfo.sample_count_data_offset == 0);
    EXRCORE_TEST (cinfo.sample_count_table_size == 0);

    exr_decode_pipeline_t decoder;
    EXRCORE_TEST_RVAL (exr_decoding_initialize (f, 0, &cinfo, &decoder));

    EXRCORE_TEST (decoder.channel_count == 2);
    EXRCORE_TEST (!strcmp (decoder.channels[0].channel_name, "G"));
    EXRCORE_TEST (decoder.channels[0].bytes_per_element == 2);
    EXRCORE_TEST (decoder.channels[0].width == 12);
    EXRCORE_TEST (decoder.channels[0].height == 24);
    EXRCORE_TEST (decoder.channels[0].x_samples == 1);
    EXRCORE_TEST (decoder.channels[0].y_samples == 1);
    EXRCORE_TEST (!strcmp (decoder.channels[1].channel_name, "Z"));
    EXRCORE_TEST (decoder.channels[1].bytes_per_element == 4);
    EXRCORE_TEST (decoder.channels[1].width == 12);
    EXRCORE_TEST (decoder.channels[1].height == 24);
    EXRCORE_TEST (decoder.channels[1].x_samples == 1);
    EXRCORE_TEST (decoder.channels[1].y_samples == 1);

    std::unique_ptr<uint8_t[]> gptr{new uint8_t[24 * 12 * 2]};
    std::unique_ptr<uint8_t[]> zptr{new uint8_t[24 * 12 * 4]};
    memset (gptr.get (), 0, 24 * 12 * 2);
    memset (zptr.get (), 0, 24 * 12 * 4);
    decoder.channels[0].decode_to_ptr          = gptr.get ();
    decoder.channels[0].user_pixel_stride      = 2;
    decoder.channels[0].user_line_stride       = 2 * 12;
    decoder.channels[0].user_bytes_per_element = 2;
    decoder.channels[1].decode_to_ptr          = zptr.get ();
    decoder.channels[1].user_pixel_stride      = 4;
    decoder.channels[1].user_line_stride       = 4 * 12;
    decoder.channels[1].user_bytes_per_element = 4;

    EXRCORE_TEST_RVAL (exr_decoding_choose_default_routines (f, 0, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

    // it is compression: none
    EXRCORE_TEST (decoder.packed_buffer == NULL);
    // it is compression: none
    EXRCORE_TEST (decoder.unpacked_buffer == NULL);
    /* TODO: add actual comparison against C++ library */
    const uint16_t* curg = reinterpret_cast<const uint16_t*> (gptr.get ());
    const float*    curz = reinterpret_cast<const float*> (zptr.get ());
    EXRCORE_TEST (*curg == 0x33d5);
    EXRCORE_TEST (fabsf (*curz - 0.244778f) < 0.000001f);
    //for ( int y = 0; y < 24; ++y )
    //{
    //    for ( int x = 0; x < 12; ++x )
    //        std::cout << ' ' << std::hex << std::setw( 4 ) << std::setfill( '0' ) << *curg++ << std::dec << " (" << *curz++ << " )";
    //    std::cout << std::endl;
    //}

    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
    exr_finish (&f);
}